

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralProduct.h
# Opt level: O2

void Eigen::internal::gemv_selector<2,0,true>::
     run<Eigen::GeneralProduct<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,4>,Eigen::Matrix<double,_1,1,0,_1,1>>
               (GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4>
                *prod,Matrix<double,__1,_1,_0,__1,_1> *dest,Scalar *alpha)

{
  size_t size;
  LhsNested pMVar1;
  RhsNested pMVar2;
  double *lhs;
  long rows;
  long cols;
  double *rhs;
  long rhsIncr;
  double *pdVar3;
  double *pdVar4;
  Scalar alpha_00;
  double dStack_48;
  undefined1 local_40 [8];
  aligned_stack_memory_handler<double> actualDestPtr_stack_memory_destructor;
  
  pMVar1 = (prod->
           super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
           ).m_lhs;
  pMVar2 = (prod->
           super_ProductBase<Eigen::GeneralProduct<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
           ).m_rhs;
  actualDestPtr_stack_memory_destructor.m_ptr =
       (double *)
       (dest->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  alpha_00 = *alpha;
  if ((ulong)actualDestPtr_stack_memory_destructor.m_ptr >> 0x3d != 0) {
    actualDestPtr_stack_memory_destructor._16_8_ = *alpha;
    throw_std_bad_alloc();
    actualDestPtr_stack_memory_destructor.m_ptr =
         (double *)
         (dest->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
    alpha_00 = (Scalar)actualDestPtr_stack_memory_destructor._16_8_;
  }
  pdVar3 = (dest->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  if (pdVar3 == (double *)0x0) {
    size = (long)actualDestPtr_stack_memory_destructor.m_ptr * 8;
    if (size < 0x20001) {
      pdVar3 = (double *)((long)&dStack_48 - (size + 0xf & 0xfffffffffffffff0));
      local_40 = (undefined1  [8])pdVar3;
      pdVar4 = pdVar3;
    }
    else {
      actualDestPtr_stack_memory_destructor._16_8_ = alpha_00;
      pdVar3 = (double *)aligned_malloc(size);
      actualDestPtr_stack_memory_destructor.m_ptr =
           (double *)
           (dest->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
      local_40 = (undefined1  [8])(double *)0x0;
      pdVar4 = &dStack_48;
      alpha_00 = (Scalar)actualDestPtr_stack_memory_destructor._16_8_;
      if ((dest->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data ==
          (double *)0x0) {
        local_40 = (undefined1  [8])pdVar3;
        pdVar4 = &dStack_48;
      }
    }
  }
  else {
    local_40 = (undefined1  [8])(double *)0x0;
    pdVar4 = &dStack_48;
  }
  actualDestPtr_stack_memory_destructor.m_size._0_1_ =
       0x20000 < (ulong)((long)actualDestPtr_stack_memory_destructor.m_ptr * 8);
  lhs = (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  rows = (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
  ;
  cols = (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols
  ;
  rhs = (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  pdVar4[-1] = 4.94065645841247e-324;
  rhsIncr = (long)pdVar4[-1];
  pdVar4[-1] = 4.94065645841247e-324;
  pdVar4[-2] = (double)pdVar3;
  pdVar4[-3] = 5.2981969443384e-318;
  general_matrix_vector_product<long,_double,_0,_false,_double,_false,_0>::run
            (rows,cols,lhs,rows,rhs,rhsIncr,(ResScalar *)pdVar4[-2],(long)pdVar4[-1],alpha_00);
  pdVar4[-1] = 5.29825129155944e-318;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)local_40);
  return;
}

Assistant:

static inline void run(const ProductType& prod, Dest& dest, const typename ProductType::Scalar& alpha)
  {
    typedef typename ProductType::Index Index;
    typedef typename ProductType::LhsScalar   LhsScalar;
    typedef typename ProductType::RhsScalar   RhsScalar;
    typedef typename ProductType::Scalar      ResScalar;
    typedef typename ProductType::RealScalar  RealScalar;
    typedef typename ProductType::ActualLhsType ActualLhsType;
    typedef typename ProductType::ActualRhsType ActualRhsType;
    typedef typename ProductType::LhsBlasTraits LhsBlasTraits;
    typedef typename ProductType::RhsBlasTraits RhsBlasTraits;
    typedef Map<Matrix<ResScalar,Dynamic,1>, Aligned> MappedDest;

    ActualLhsType actualLhs = LhsBlasTraits::extract(prod.lhs());
    ActualRhsType actualRhs = RhsBlasTraits::extract(prod.rhs());

    ResScalar actualAlpha = alpha * LhsBlasTraits::extractScalarFactor(prod.lhs())
                                  * RhsBlasTraits::extractScalarFactor(prod.rhs());

    // make sure Dest is a compile-time vector type (bug 1166)
    typedef typename conditional<Dest::IsVectorAtCompileTime, Dest, typename Dest::ColXpr>::type ActualDest;

    enum {
      // FIXME find a way to allow an inner stride on the result if packet_traits<Scalar>::size==1
      // on, the other hand it is good for the cache to pack the vector anyways...
      EvalToDestAtCompileTime = (ActualDest::InnerStrideAtCompileTime==1),
      ComplexByReal = (NumTraits<LhsScalar>::IsComplex) && (!NumTraits<RhsScalar>::IsComplex),
      MightCannotUseDest = (ActualDest::InnerStrideAtCompileTime!=1) || ComplexByReal
    };

    gemv_static_vector_if<ResScalar,ActualDest::SizeAtCompileTime,ActualDest::MaxSizeAtCompileTime,MightCannotUseDest> static_dest;

    bool alphaIsCompatible = (!ComplexByReal) || (numext::imag(actualAlpha)==RealScalar(0));
    bool evalToDest = EvalToDestAtCompileTime && alphaIsCompatible;
    
    RhsScalar compatibleAlpha = get_factor<ResScalar,RhsScalar>::run(actualAlpha);

    ei_declare_aligned_stack_constructed_variable(ResScalar,actualDestPtr,dest.size(),
                                                  evalToDest ? dest.data() : static_dest.data());
    
    if(!evalToDest)
    {
      #ifdef EIGEN_DENSE_STORAGE_CTOR_PLUGIN
      int size = dest.size();
      EIGEN_DENSE_STORAGE_CTOR_PLUGIN
      #endif
      if(!alphaIsCompatible)
      {
        MappedDest(actualDestPtr, dest.size()).setZero();
        compatibleAlpha = RhsScalar(1);
      }
      else
        MappedDest(actualDestPtr, dest.size()) = dest;
    }

    general_matrix_vector_product
      <Index,LhsScalar,ColMajor,LhsBlasTraits::NeedToConjugate,RhsScalar,RhsBlasTraits::NeedToConjugate>::run(
        actualLhs.rows(), actualLhs.cols(),
        actualLhs.data(), actualLhs.outerStride(),
        actualRhs.data(), actualRhs.innerStride(),
        actualDestPtr, 1,
        compatibleAlpha);

    if (!evalToDest)
    {
      if(!alphaIsCompatible)
        dest += actualAlpha * MappedDest(actualDestPtr, dest.size());
      else
        dest = MappedDest(actualDestPtr, dest.size());
    }
  }